

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::details::
handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
::reset(handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
        *this,basic_ifstream<char,_std::char_traits<char>_> *new_val)

{
  bool bVar1;
  basic_ifstream<char,_std::char_traits<char>_> *pbVar2;
  
  pbVar2 = this->_val;
  bVar1 = this->_empty;
  this->_val = new_val;
  this->_empty = new_val == (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
  if (pbVar2 == (basic_ifstream<char,_std::char_traits<char>_> *)0x0 || bVar1 != false) {
    return;
  }
  (**(code **)(*(long *)pbVar2 + 8))();
  return;
}

Assistant:

void reset(T new_val) {
    handle tmp(new_val);
    swap(tmp);
  }